

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_block_item(SyntaxAnalyze *this)

{
  bool bVar1;
  SyntaxAnalyze *in_RDI;
  SyntaxAnalyze *unaff_retaddr;
  SyntaxAnalyze *in_stack_000000b0;
  SyntaxAnalyze *pSVar2;
  
  pSVar2 = in_RDI;
  bVar1 = try_word(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(Token)in_RDI);
  if (bVar1) {
    gm_const_decl(in_RDI);
  }
  else {
    bVar1 = try_word(unaff_retaddr,(int)((ulong)pSVar2 >> 0x20),(Token)pSVar2);
    if (bVar1) {
      gm_var_decl(in_RDI);
    }
    else {
      gm_stmt(in_stack_000000b0);
    }
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_block_item() {
  if (try_word(1, Token::CONSTTK)) {
    gm_const_decl();
  } else if (try_word(1, Token::INTTK)) {
    gm_var_decl();
  } else {
    gm_stmt();
  }
}